

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O1

uint32_t __thiscall spirv_cross::CFG::find_common_dominator(CFG *this,uint32_t a,uint32_t b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  if (a != b) {
    do {
      uVar1 = get_visit_order(this,a);
      uVar2 = get_visit_order(this,b);
      if (uVar1 < uVar2) {
        a = get_immediate_dominator(this,a);
      }
      else {
        b = get_immediate_dominator(this,b);
      }
    } while (a != b);
  }
  return a;
}

Assistant:

uint32_t CFG::find_common_dominator(uint32_t a, uint32_t b) const
{
	while (a != b)
	{
		if (get_visit_order(a) < get_visit_order(b))
			a = get_immediate_dominator(a);
		else
			b = get_immediate_dominator(b);
	}
	return a;
}